

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  long in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_RDI;
  int ret;
  secp256k1_scalar sec;
  uint in_stack_ffffffffffffffb8;
  secp256k1_callback *in_stack_ffffffffffffffc0;
  uint local_4;
  
  if (in_RDI == (secp256k1_scalar *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x29f,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffc0,(char *)(ulong)in_stack_ffffffffffffffb8);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffc0,(char *)(ulong)in_stack_ffffffffffffffb8);
    local_4 = 0;
  }
  else {
    uVar1 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)in_stack_ffffffffffffffc0,
                       (uchar *)(ulong)in_stack_ffffffffffffffb8);
    local_4 = secp256k1_ec_seckey_tweak_add_helper(in_RDI,in_RSI);
    local_4 = local_4 & uVar1;
    secp256k1_scalar_cmov((secp256k1_scalar *)sec.d[3],(secp256k1_scalar *)sec.d[2],sec.d[1]._4_4_);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_ffffffffffffffc0,
               (secp256k1_scalar *)CONCAT44(local_4,in_stack_ffffffffffffffb8));
    secp256k1_scalar_clear((secp256k1_scalar *)0x104a89);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}